

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O1

void writeRgbaWithPreview2(char *fileName,int width,int height)

{
  Rgba *pRVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int x;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  undefined1 *puVar10;
  float fVar11;
  float fVar12;
  RgbaOutputFile file;
  Array<Imf_3_2::Rgba> pixels;
  Header header;
  Rgba local_a8 [3];
  Array<Imf_3_2::Rgba> local_90;
  long local_80;
  ulong local_78;
  long local_70;
  Header local_68 [56];
  
  lVar5 = (long)width;
  uVar7 = 0xffffffffffffffff;
  if (-1 < width) {
    uVar7 = lVar5 * 8;
  }
  iVar2 = width + 7;
  if (-1 < width) {
    iVar2 = width;
  }
  local_90._data = (Rgba *)operator_new__(uVar7);
  iVar8 = height + 7;
  if (-1 < height) {
    iVar8 = height;
  }
  local_80 = (long)(iVar2 >> 3);
  uVar6 = (iVar8 >> 3) * local_80;
  local_90._size = lVar5;
  local_78 = (ulong)(uint)height;
  pvVar3 = operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
  uVar7 = local_78;
  if (uVar6 != 0) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pvVar3 + lVar4) = 0xff000000;
      lVar4 = lVar4 + 4;
    } while (uVar6 * 4 - lVar4 != 0);
  }
  local_a8[0].r._h = 0;
  local_a8[0].g._h = 0;
  local_a8[0].b._h = 0;
  local_a8[0].a._h = 0;
  iVar9 = (int)local_78;
  Imf_3_2::Header::Header(local_68,width,local_78 & 0xffffffff,local_a8,0,3);
  Imf_3_2::PreviewImage::PreviewImage
            ((PreviewImage *)local_a8,iVar2 >> 3,iVar8 >> 3,(PreviewRgba *)0x0);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)local_68);
  Imf_3_2::PreviewImage::~PreviewImage((PreviewImage *)local_a8);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_a8,fileName,local_68,WRITE_RGBA,iVar2);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_a8,(ulong)local_90._data,1);
  if (0 < iVar9) {
    local_70 = (long)pvVar3 + 3;
    local_80 = local_80 << 2;
    uVar6 = 0;
    do {
      drawImage7(&local_90,width,(int)uVar7,(int)uVar6);
      Imf_3_2::RgbaOutputFile::writePixels((int)local_a8);
      if ((uVar6 & 7) == 0 && 0 < width) {
        puVar10 = (undefined1 *)((uVar6 >> 3) * local_80 + local_70);
        lVar4 = 0;
        do {
          pRVar1 = local_90._data;
          fVar12 = *(float *)(_imath_half_to_float_table + (ulong)local_90._data[lVar4].r._h * 4);
          if (fVar12 <= 0.0) {
            fVar12 = 0.0;
          }
          fVar11 = powf(fVar12 * 5.5555,0.4545);
          fVar11 = fVar11 * 84.66;
          fVar12 = 255.0;
          if (fVar11 <= 255.0) {
            fVar12 = fVar11;
          }
          puVar10[-3] = (char)(int)(float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12);
          fVar12 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar4].g._h * 4);
          if (fVar12 <= 0.0) {
            fVar12 = 0.0;
          }
          fVar11 = powf(fVar12 * 5.5555,0.4545);
          fVar11 = fVar11 * 84.66;
          fVar12 = 255.0;
          if (fVar11 <= 255.0) {
            fVar12 = fVar11;
          }
          puVar10[-2] = (char)(int)(float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12);
          fVar12 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar4].b._h * 4);
          if (fVar12 <= 0.0) {
            fVar12 = 0.0;
          }
          fVar11 = powf(fVar12 * 5.5555,0.4545);
          fVar11 = fVar11 * 84.66;
          fVar12 = 255.0;
          if (fVar11 <= 255.0) {
            fVar12 = fVar11;
          }
          puVar10[-1] = (char)(int)(float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12);
          fVar11 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar4].a._h * 4) * 255.0;
          fVar12 = 255.0;
          if (fVar11 <= 255.0) {
            fVar12 = fVar11;
          }
          *puVar10 = (char)(int)(float)(-(uint)(fVar11 < 0.0) & 0x3f000000 |
                                       ~-(uint)(fVar11 < 0.0) & (uint)(fVar12 + 0.5));
          lVar4 = lVar4 + 8;
          puVar10 = puVar10 + 4;
        } while (lVar4 < lVar5);
      }
      uVar6 = uVar6 + 1;
      uVar7 = local_78;
    } while ((int)uVar6 != (int)local_78);
  }
  Imf_3_2::RgbaOutputFile::updatePreviewImage((PreviewRgba *)local_a8);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_a8);
  Imf_3_2::Header::~Header(local_68);
  operator_delete__(pvVar3);
  if (local_90._data != (Rgba *)0x0) {
    operator_delete__(local_90._data);
  }
  return;
}

Assistant:

void
writeRgbaWithPreview2 (const char fileName[], int width, int height)
{
    //
    // Write an image file with a preview image, version 2:
    //
    // - generate a file header
    // - add a dummy preview image to the file header
    // - open the file (this stores the header with the dummy
    //   preview image in the file)
    // - render the main image's pixels one scan line at a time,
    //   and store each scan line in the file before rendering
    //   the next scan line
    // - generate the preview image on the fly, while the main
    //   image is being rendered
    // - once the main image has been rendered, store the preview
    //   image in the file, overwriting the dummy preview
    //

    Array<Rgba> pixels (width);

    const int N = 8;

    int                  previewWidth  = width / N;
    int                  previewHeight = height / N;
    Array2D<PreviewRgba> previewPixels (previewHeight, previewWidth);

    Header header (width, height);
    header.setPreviewImage (PreviewImage (previewWidth, previewHeight));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, 0);

    for (int y = 0; y < height; ++y)
    {
        drawImage7 (pixels, width, height, y);
        file.writePixels (1);

        if (y % N == 0)
        {
            for (int x = 0; x < width; x += N)
            {
                const Rgba&  inPixel  = pixels[x];
                PreviewRgba& outPixel = previewPixels[y / N][x / N];

                outPixel.r = gamma (inPixel.r);
                outPixel.g = gamma (inPixel.g);
                outPixel.b = gamma (inPixel.b);
                outPixel.a = int (
                    IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) +
                    0.5f);
            }
        }
    }

    file.updatePreviewImage (&previewPixels[0][0]);
}